

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

void shuffle64(LONGLONG *a,int n,int n2,LONGLONG *tmp)

{
  long lVar1;
  LONGLONG *pLVar2;
  LONGLONG *pLVar3;
  int iVar4;
  
  pLVar3 = a + n2;
  if (1 < n) {
    lVar1 = 0;
    pLVar2 = pLVar3;
    do {
      *(LONGLONG *)((long)tmp + lVar1 * 4) = *pLVar2;
      pLVar2 = pLVar2 + n2 * 2;
      iVar4 = (int)lVar1;
      lVar1 = lVar1 + 2;
    } while (iVar4 + 3 < n);
  }
  if (2 < n) {
    pLVar2 = a + n2 * 2;
    iVar4 = 2;
    do {
      *pLVar3 = *pLVar2;
      iVar4 = iVar4 + 2;
      pLVar2 = pLVar2 + n2 * 2;
      pLVar3 = pLVar3 + n2;
    } while (iVar4 < n);
  }
  if (1 < n) {
    lVar1 = 0;
    do {
      *pLVar3 = *(LONGLONG *)((long)tmp + lVar1 * 4);
      pLVar3 = pLVar3 + n2;
      iVar4 = (int)lVar1;
      lVar1 = lVar1 + 2;
    } while (iVar4 + 3 < n);
  }
  return;
}

Assistant:

static void
shuffle64(LONGLONG a[], int n, int n2, LONGLONG tmp[])
{

/* 
LONGLONG a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
LONGLONG tmp[];	 scratch storage					
*/

int i;
LONGLONG *p1, *p2, *pt;

	/*
	 * copy odd elements to tmp
	 */
	pt = tmp;
	p1 = &a[n2];
	for (i=1; i < n; i += 2) {
		*pt = *p1;
		pt += 1;
		p1 += (n2+n2);
	}
	/*
	 * compress even elements into first half of A
	 */
	p1 = &a[n2];
	p2 = &a[n2+n2];
	for (i=2; i<n; i += 2) {
		*p1 = *p2;
		p1 += n2;
		p2 += (n2+n2);
	}
	/*
	 * put odd elements into 2nd half
	 */
	pt = tmp;
	for (i = 1; i<n; i += 2) {
		*p1 = *pt;
		p1 += n2;
		pt += 1;
	}
}